

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O0

void reverse_chars(string *from,string *to)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  _Ios_Iostate _Var4;
  long *plVar5;
  reference pcVar6;
  string local_4e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0 [32];
  undefined1 local_4a0 [8];
  undefined1 local_498 [8];
  reverse_iterator rit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470 [39];
  value_type local_449;
  undefined1 local_448 [7];
  char ch;
  vector<char,_std::allocator<char>_> chars;
  ofstream out_file;
  long local_220;
  ifstream in_file;
  string *to_local;
  string *from_local;
  
  std::ifstream::ifstream(&local_220,from,8);
  bVar2 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar2 & 1) != 0) {
    file_open_err(from,in);
  }
  std::ofstream::ofstream
            (&chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,to,0x10);
  bVar2 = std::ios::operator!((ios *)(&chars.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                       .field_0x10 +
                                     *(long *)(chars.super__Vector_base<char,_std::allocator<char>_>
                                               ._M_impl._16_8_ + -0x18)));
  if ((bVar2 & 1) != 0) {
    file_open_err(to,out);
  }
  uVar1 = *(undefined8 *)(local_220 + -0x18);
  _Var4 = std::ios::exceptions();
  std::operator|(_Var4,_S_badbit);
  std::ios::exceptions((int)&local_220 + (int)uVar1);
  uVar1 = *(undefined8 *)
           (chars.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + -0x18);
  _Var4 = std::ios::exceptions();
  std::operator|(_Var4,_S_badbit);
  std::ios::exceptions((int)&chars + 0x10 + (int)uVar1);
  memset(local_448,0,0x18);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_448)
  ;
  local_449 = '\0';
  while( true ) {
    plVar5 = (long *)std::istream::get((char *)&local_220);
    bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
    if (!bVar3) break;
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)local_448,&local_449);
  }
  bVar2 = std::ios::fail();
  if (((bVar2 & 1) != 0) && (bVar2 = std::ios::eof(), (bVar2 & 1) == 0)) {
    std::operator+((char *)&rit,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "An error occurred while reading data from file \'");
    std::operator+(local_470,(char *)&rit);
    error(local_470);
    std::__cxx11::string::~string((string *)local_470);
    std::__cxx11::string::~string((string *)&rit);
  }
  std::vector<char,_std::allocator<char>_>::rbegin((vector<char,_std::allocator<char>_> *)local_498)
  ;
  while( true ) {
    std::vector<char,_std::allocator<char>_>::rend((vector<char,_std::allocator<char>_> *)local_4a0)
    ;
    bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                             *)local_498,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                             *)local_4a0);
    if (!bVar3) break;
    pcVar6 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
             ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                          *)local_498);
    std::operator<<((ostream *)
                    &chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                    *pcVar6);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                  *)local_498);
  }
  bVar2 = std::ios::fail();
  if ((bVar2 & 1) != 0) {
    std::operator+((char *)local_4e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "An error occurred while writing data to file \'");
    std::operator+(local_4c0,(char *)local_4e0);
    error(local_4c0);
    std::__cxx11::string::~string((string *)local_4c0);
    std::__cxx11::string::~string(local_4e0);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_448);
  std::ofstream::~ofstream
            (&chars.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void reverse_chars(const std::string& from, const std::string& to)
{
	std::ifstream in_file{ from };
	if (!in_file)
	{
		file_open_err(from, FileType::in);
	}
	std::ofstream out_file{ to };
	if (!out_file)
	{
		file_open_err(to, FileType::out);
	}
	in_file.exceptions(in_file.exceptions() | std::ios::badbit);
	out_file.exceptions(out_file.exceptions() | std::ios::badbit);
	auto chars = std::vector<char>();
	for (auto ch = char(); in_file.get(ch);)
	{
		chars.push_back(ch);
	}
	if (in_file.fail() && !in_file.eof())
	{
		error("An error occurred while reading data from file '" + from + "'.");
	}

	for (auto rit = chars.rbegin(); rit != chars.rend(); ++rit)
	{
		out_file << *rit;
	}
	if (out_file.fail())
	{
		error("An error occurred while writing data to file '" + to + "'.");
	}
}